

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O1

void __thiscall r_exec::View::set_res(View *this,double value)

{
  char cVar1;
  float fVar2;
  Atom local_2c [4];
  double local_28;
  
  local_28 = value;
  r_code::Atom::PlusInfinity();
  cVar1 = r_code::Atom::operator==((Atom *)&(this->super_View).field_0x38,local_2c);
  r_code::Atom::~Atom(local_2c);
  if (cVar1 == '\0') {
    fVar2 = (float)r_code::Atom::asFloat();
    this->acc_res = (float)((double)this->acc_res + (local_28 - (double)fVar2));
    this->res_changes = this->res_changes + 1;
  }
  return;
}

Assistant:

void View::set_res(double value)
{
    if (code(VIEW_RES) == Atom::PlusInfinity()) {
        return;
    }

    acc_res += value - get_res();
    ++res_changes;
}